

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  void *__s1;
  void *__s2;
  int iVar4;
  data_t dVar5;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pdVar2 = result->data;
  if (((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  uVar3 = *(ulong *)left->data;
  if (uVar3 == *(ulong *)right->data) {
    __s1 = *(void **)((long)left->data + 8);
    __s2 = *(void **)((long)right->data + 8);
    dVar5 = '\x01';
    if (__s1 == __s2) goto LAB_0138964a;
    if (0xc < (uint)uVar3) {
      iVar4 = bcmp(__s1,__s2,uVar3 & 0xffffffff);
      if (iVar4 == 0) goto LAB_0138964a;
    }
  }
  dVar5 = '\0';
LAB_0138964a:
  *pdVar2 = dVar5;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}